

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  Mat *pMVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  int *piVar13;
  pointer ppLVar14;
  void *pvVar15;
  Layer *pLVar16;
  Option *pOVar17;
  pointer ppLVar18;
  Allocator *pAVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  Option opt;
  ParamDict pd;
  Mat local_618;
  ModelBinFromMatArray local_5d8;
  size_t local_5c8;
  Allocator *local_5c0;
  undefined4 local_5b8;
  int local_5b4;
  undefined8 local_5b0;
  long local_5a8;
  void *local_5a0;
  int *local_598;
  size_t local_590;
  Allocator *local_588;
  undefined4 local_580;
  int local_57c;
  undefined8 local_578;
  long local_570;
  undefined8 local_568;
  Allocator *pAStack_560;
  Allocator *local_558;
  undefined1 local_548 [8];
  int *piStack_540;
  size_t local_538;
  Allocator *local_530;
  undefined4 local_528;
  int iStack_524;
  size_t sStack_520;
  Allocator *local_518 [157];
  
  (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)local_548) {
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + 1;
      UNLOCK();
    }
    piVar13 = (this->weight_data).refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar15 = (this->weight_data).data;
        pAVar19 = (this->weight_data).allocator;
        if (pAVar19 == (Allocator *)0x0) {
          if (pvVar15 != (void *)0x0) {
            free(*(void **)((long)pvVar15 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar19 + 8))();
        }
      }
    }
    (this->weight_data).data = (void *)local_548;
    (this->weight_data).refcount = piStack_540;
    (this->weight_data).elemsize = local_538;
    (this->weight_data).allocator = local_530;
    (this->weight_data).dims = local_528;
    (this->weight_data).w = iStack_524;
    (this->weight_data).h = (undefined4)sStack_520;
    (this->weight_data).c = sStack_520._4_4_;
    (this->weight_data).cstep = (size_t)local_518[0];
  }
  if (piStack_540 != (int *)0x0) {
    LOCK();
    *piStack_540 = *piStack_540 + -1;
    UNLOCK();
    if (*piStack_540 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->num_output,1);
    if (&this->bias_data != (Mat *)local_548) {
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + 1;
        UNLOCK();
      }
      piVar13 = (this->bias_data).refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pvVar15 = (this->bias_data).data;
          pAVar19 = (this->bias_data).allocator;
          if (pAVar19 == (Allocator *)0x0) {
            if (pvVar15 != (void *)0x0) {
              free(*(void **)((long)pvVar15 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar19 + 8))();
          }
        }
      }
      (this->bias_data).data = (void *)local_548;
      (this->bias_data).refcount = piStack_540;
      (this->bias_data).elemsize = local_538;
      (this->bias_data).allocator = local_530;
      (this->bias_data).dims = local_528;
      (this->bias_data).w = iStack_524;
      (this->bias_data).h = (undefined4)sStack_520;
      (this->bias_data).c = sStack_520._4_4_;
      (this->bias_data).cstep = (size_t)local_518[0];
    }
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + -1;
      UNLOCK();
      if (*piStack_540 == 0) {
        if (local_530 == (Allocator *)0x0) {
          if (local_548 != (undefined1  [8])0x0) {
            free(*(void **)((long)local_548 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_530 + 8))();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  if (this->int8_scale_term != 2) {
    if (this->int8_scale_term == 1) {
      (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->group,1);
      if (&this->weight_data_int8_scales != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar13 = (this->weight_data_int8_scales).refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            pvVar15 = (this->weight_data_int8_scales).data;
            pAVar19 = (this->weight_data_int8_scales).allocator;
            if (pAVar19 == (Allocator *)0x0) {
              if (pvVar15 != (void *)0x0) {
                free(*(void **)((long)pvVar15 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar19 + 8))();
            }
          }
        }
        (this->weight_data_int8_scales).data = (void *)local_548;
        (this->weight_data_int8_scales).refcount = piStack_540;
        (this->weight_data_int8_scales).elemsize = local_538;
        (this->weight_data_int8_scales).allocator = local_530;
        (this->weight_data_int8_scales).dims = local_528;
        (this->weight_data_int8_scales).w = iStack_524;
        (this->weight_data_int8_scales).h = (undefined4)sStack_520;
        (this->weight_data_int8_scales).c = sStack_520._4_4_;
        (this->weight_data_int8_scales).cstep = (size_t)local_518[0];
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->group,1);
      if (&this->bottom_blob_int8_scales != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar13 = (this->bottom_blob_int8_scales).refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            pvVar15 = (this->bottom_blob_int8_scales).data;
            pAVar19 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar19 == (Allocator *)0x0) {
              if (pvVar15 != (void *)0x0) {
                free(*(void **)((long)pvVar15 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar19 + 8))();
            }
          }
        }
        (this->bottom_blob_int8_scales).data = (void *)local_548;
        (this->bottom_blob_int8_scales).refcount = piStack_540;
        (this->bottom_blob_int8_scales).elemsize = local_538;
        (this->bottom_blob_int8_scales).allocator = local_530;
        (this->bottom_blob_int8_scales).dims = local_528;
        (this->bottom_blob_int8_scales).w = iStack_524;
        (this->bottom_blob_int8_scales).h = (undefined4)sStack_520;
        (this->bottom_blob_int8_scales).c = sStack_520._4_4_;
        (this->bottom_blob_int8_scales).cstep = (size_t)local_518[0];
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
    }
    goto LAB_00137a41;
  }
  (**mb->_vptr_ModelBin)(local_548,mb,1,1);
  pMVar2 = &this->weight_data_int8_scales;
  if (pMVar2 != (Mat *)local_548) {
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + 1;
      UNLOCK();
    }
    piVar13 = (this->weight_data_int8_scales).refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar15 = (this->weight_data_int8_scales).data;
        pAVar19 = (this->weight_data_int8_scales).allocator;
        if (pAVar19 == (Allocator *)0x0) {
          if (pvVar15 != (void *)0x0) {
            free(*(void **)((long)pvVar15 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar19 + 8))();
        }
      }
    }
    (this->weight_data_int8_scales).data = (void *)local_548;
    (this->weight_data_int8_scales).refcount = piStack_540;
    (this->weight_data_int8_scales).elemsize = local_538;
    (this->weight_data_int8_scales).allocator = local_530;
    (this->weight_data_int8_scales).dims = local_528;
    (this->weight_data_int8_scales).w = iStack_524;
    (this->weight_data_int8_scales).h = (undefined4)sStack_520;
    (this->weight_data_int8_scales).c = sStack_520._4_4_;
    (this->weight_data_int8_scales).cstep = (size_t)local_518[0];
  }
  if (piStack_540 != (int *)0x0) {
    LOCK();
    *piStack_540 = *piStack_540 + -1;
    UNLOCK();
    if (*piStack_540 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
  (**mb->_vptr_ModelBin)(local_548,mb,1,1);
  pMVar3 = &this->bottom_blob_int8_scales;
  if (pMVar3 != (Mat *)local_548) {
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + 1;
      UNLOCK();
    }
    piVar13 = (this->bottom_blob_int8_scales).refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar15 = (this->bottom_blob_int8_scales).data;
        pAVar19 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar19 == (Allocator *)0x0) {
          if (pvVar15 != (void *)0x0) {
            free(*(void **)((long)pvVar15 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar19 + 8))();
        }
      }
    }
    (this->bottom_blob_int8_scales).data = (void *)local_548;
    (this->bottom_blob_int8_scales).refcount = piStack_540;
    (this->bottom_blob_int8_scales).elemsize = local_538;
    (this->bottom_blob_int8_scales).allocator = local_530;
    (this->bottom_blob_int8_scales).dims = local_528;
    (this->bottom_blob_int8_scales).w = iStack_524;
    (this->bottom_blob_int8_scales).h = (undefined4)sStack_520;
    (this->bottom_blob_int8_scales).c = sStack_520._4_4_;
    (this->bottom_blob_int8_scales).cstep = (size_t)local_518[0];
  }
  if (piStack_540 != (int *)0x0) {
    LOCK();
    *piStack_540 = *piStack_540 + -1;
    UNLOCK();
    if (*piStack_540 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
  uVar4 = *(this->weight_data_int8_scales).data;
  iStack_524 = this->group;
  pAVar19 = (Allocator *)(long)iStack_524;
  _local_548 = (undefined1  [16])0x0;
  local_538 = 4;
  local_530 = (Allocator *)0x0;
  local_528 = 1;
  sStack_520 = 0x100000001;
  local_518[0] = pAVar19;
  if (pAVar19 == (Allocator *)0x0) {
    if (pMVar2 != (Mat *)local_548) goto LAB_00137586;
  }
  else {
    pvVar15 = malloc((long)pAVar19 * 4 + 0x1c);
    local_548 = (undefined1  [8])((long)pvVar15 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_548 - 8) = pvVar15;
    piVar13 = (int *)((long)local_548 + (long)pAVar19 * 4);
    piStack_540 = piVar13;
    *piVar13 = 1;
    if (pMVar2 != (Mat *)local_548) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
LAB_00137586:
      piVar13 = (this->weight_data_int8_scales).refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pvVar15 = (this->weight_data_int8_scales).data;
          pAVar19 = (this->weight_data_int8_scales).allocator;
          if (pAVar19 == (Allocator *)0x0) {
            if (pvVar15 != (void *)0x0) {
              free(*(void **)((long)pvVar15 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar19 + 8))();
          }
        }
      }
      (this->weight_data_int8_scales).data = (void *)local_548;
      (this->weight_data_int8_scales).refcount = piStack_540;
      (this->weight_data_int8_scales).elemsize = local_538;
      (this->weight_data_int8_scales).allocator = local_530;
      (this->weight_data_int8_scales).dims = local_528;
      (this->weight_data_int8_scales).w = iStack_524;
      (this->weight_data_int8_scales).h = (undefined4)sStack_520;
      (this->weight_data_int8_scales).c = sStack_520._4_4_;
      (this->weight_data_int8_scales).cstep = (size_t)local_518[0];
      piVar13 = piStack_540;
      if (piStack_540 == (int *)0x0) goto LAB_00137676;
    }
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
LAB_00137676:
  auVar10 = _DAT_0013a4c0;
  auVar9 = _DAT_0013a4b0;
  auVar8 = _DAT_0013a440;
  uVar11 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
  if (0 < (int)uVar11) {
    pvVar15 = pMVar2->data;
    lVar21 = (ulong)uVar11 - 1;
    auVar24._8_4_ = (int)lVar21;
    auVar24._0_8_ = lVar21;
    auVar24._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar22 = 0;
    auVar24 = auVar24 ^ _DAT_0013a440;
    do {
      auVar25._8_4_ = (int)uVar22;
      auVar25._0_8_ = uVar22;
      auVar25._12_4_ = (int)(uVar22 >> 0x20);
      auVar27 = (auVar25 | auVar10) ^ auVar8;
      iVar12 = auVar24._4_4_;
      if ((bool)(~(auVar27._4_4_ == iVar12 && auVar24._0_4_ < auVar27._0_4_ ||
                  iVar12 < auVar27._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar15 + uVar22 * 4) = uVar4;
      }
      if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
          auVar27._12_4_ <= auVar24._12_4_) {
        *(undefined4 *)((long)pvVar15 + uVar22 * 4 + 4) = uVar4;
      }
      auVar25 = (auVar25 | auVar9) ^ auVar8;
      iVar28 = auVar25._4_4_;
      if (iVar28 <= iVar12 && (iVar28 != iVar12 || auVar25._0_4_ <= auVar24._0_4_)) {
        *(undefined4 *)((long)pvVar15 + uVar22 * 4 + 8) = uVar4;
        *(undefined4 *)((long)pvVar15 + uVar22 * 4 + 0xc) = uVar4;
      }
      uVar22 = uVar22 + 4;
    } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
  }
  uVar4 = *(this->bottom_blob_int8_scales).data;
  iStack_524 = this->group;
  pAVar19 = (Allocator *)(long)iStack_524;
  _local_548 = (undefined1  [16])0x0;
  local_538 = 4;
  local_530 = (Allocator *)0x0;
  local_528 = 1;
  sStack_520 = 0x100000001;
  local_518[0] = pAVar19;
  if (pAVar19 == (Allocator *)0x0) {
    if (pMVar3 != (Mat *)local_548) goto LAB_00137848;
  }
  else {
    pvVar15 = malloc((long)pAVar19 * 4 + 0x1c);
    local_548 = (undefined1  [8])((long)pvVar15 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_548 - 8) = pvVar15;
    piVar13 = (int *)((long)local_548 + (long)pAVar19 * 4);
    piStack_540 = piVar13;
    *piVar13 = 1;
    if (pMVar3 != (Mat *)local_548) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
LAB_00137848:
      piVar13 = (this->bottom_blob_int8_scales).refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pvVar15 = (this->bottom_blob_int8_scales).data;
          pAVar19 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar19 == (Allocator *)0x0) {
            if (pvVar15 != (void *)0x0) {
              free(*(void **)((long)pvVar15 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar19 + 8))();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = (void *)local_548;
      (this->bottom_blob_int8_scales).refcount = piStack_540;
      (this->bottom_blob_int8_scales).elemsize = local_538;
      (this->bottom_blob_int8_scales).allocator = local_530;
      (this->bottom_blob_int8_scales).dims = local_528;
      (this->bottom_blob_int8_scales).w = iStack_524;
      (this->bottom_blob_int8_scales).h = (undefined4)sStack_520;
      (this->bottom_blob_int8_scales).c = sStack_520._4_4_;
      (this->bottom_blob_int8_scales).cstep = (size_t)local_518[0];
      piVar13 = piStack_540;
      if (piStack_540 == (int *)0x0) goto LAB_00137938;
    }
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
LAB_00137938:
  auVar10 = _DAT_0013a4c0;
  auVar9 = _DAT_0013a4b0;
  auVar8 = _DAT_0013a440;
  uVar11 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
  if (0 < (int)uVar11) {
    pvVar15 = pMVar3->data;
    lVar21 = (ulong)uVar11 - 1;
    auVar27._8_4_ = (int)lVar21;
    auVar27._0_8_ = lVar21;
    auVar27._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar22 = 0;
    auVar27 = auVar27 ^ _DAT_0013a440;
    do {
      auVar26._8_4_ = (int)uVar22;
      auVar26._0_8_ = uVar22;
      auVar26._12_4_ = (int)(uVar22 >> 0x20);
      auVar24 = (auVar26 | auVar10) ^ auVar8;
      iVar12 = auVar27._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar12 && auVar27._0_4_ < auVar24._0_4_ ||
                  iVar12 < auVar24._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar15 + uVar22 * 4) = uVar4;
      }
      if ((auVar24._12_4_ != auVar27._12_4_ || auVar24._8_4_ <= auVar27._8_4_) &&
          auVar24._12_4_ <= auVar27._12_4_) {
        *(undefined4 *)((long)pvVar15 + uVar22 * 4 + 4) = uVar4;
      }
      auVar24 = (auVar26 | auVar9) ^ auVar8;
      iVar28 = auVar24._4_4_;
      if (iVar28 <= iVar12 && (iVar28 != iVar12 || auVar24._0_4_ <= auVar27._0_4_)) {
        *(undefined4 *)((long)pvVar15 + uVar22 * 4 + 8) = uVar4;
        *(undefined4 *)((long)pvVar15 + uVar22 * 4 + 0xc) = uVar4;
      }
      uVar22 = uVar22 + 4;
    } while ((uVar11 + 3 & 0xfffffffc) != uVar22);
  }
LAB_00137a41:
  ppLVar14 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar18 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar18 - (long)ppLVar14) >> 3)) {
    lVar21 = 0;
    do {
      if (ppLVar14[lVar21] != (Layer *)0x0) {
        (*ppLVar14[lVar21]->_vptr_Layer[1])();
        ppLVar14 = (this->quantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar18 = (this->quantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (int)((ulong)((long)ppLVar18 - (long)ppLVar14) >> 3));
  }
  if (ppLVar18 != ppLVar14) {
    (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar14;
  }
  ppLVar14 = (this->dequantize_ops).
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppLVar18 = (this->dequantize_ops).
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar18 - (long)ppLVar14) >> 3)) {
    lVar21 = 0;
    do {
      if (ppLVar14[lVar21] != (Layer *)0x0) {
        (*ppLVar14[lVar21]->_vptr_Layer[1])();
        ppLVar14 = (this->dequantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar18 = (this->dequantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (int)((ulong)((long)ppLVar18 - (long)ppLVar14) >> 3));
  }
  if (ppLVar18 != ppLVar14) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar14;
  }
  sVar7 = (this->weight_data).elemsize;
  if (sVar7 == 1) {
    if (this->use_int8_inference == false) {
      load_model();
      return -1;
    }
  }
  else if ((sVar7 == 4) && (this->use_int8_inference == true)) {
    local_618.cstep = (size_t)this->weight_data_size;
    local_618.elemsize = 1;
    local_618.allocator = (Allocator *)0x0;
    local_618.w = this->weight_data_size;
    local_618.dims = 1;
    local_618.h = 1;
    local_618.c = 1;
    if (local_618.cstep == 0) {
      return -100;
    }
    uVar22 = local_618.cstep + 3 & 0xfffffffffffffffc;
    pvVar15 = malloc(uVar22 + 0x1c);
    local_618.data = (void *)((long)pvVar15 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_618.data - 8) = pvVar15;
    local_618.refcount = (int *)((long)local_618.data + uVar22);
    *(undefined4 *)((long)local_618.data + uVar22) = 1;
    if (local_618.c == 0) {
      LOCK();
      *local_618.refcount = *local_618.refcount + -1;
      UNLOCK();
      if (*local_618.refcount != 0) {
        return -100;
      }
      if (local_618.allocator == (Allocator *)0x0) {
        if (local_618.data != (void *)0x0) {
          free(*(void **)((long)local_618.data - 8));
          return -100;
        }
        return -100;
      }
      (**(code **)(*(long *)local_618.allocator + 8))();
      return -100;
    }
    iVar12 = this->weight_data_size / this->group;
    if (0 < this->group) {
      lVar20 = (long)iVar12;
      lVar21 = 0;
      do {
        pLVar16 = create_layer(0x39);
        ParamDict::ParamDict((ParamDict *)local_548);
        ParamDict::set((ParamDict *)local_548,0,
                       *(float *)((long)(this->weight_data_int8_scales).data + lVar21 * 4));
        (*pLVar16->_vptr_Layer[2])(pLVar16,(ParamDict *)local_548);
        pOVar17 = get_default_option();
        local_568._0_1_ = pOVar17->lightmode;
        local_568._1_3_ = *(undefined3 *)&pOVar17->field_0x1;
        local_568._4_4_ = pOVar17->num_threads;
        local_558 = pOVar17->workspace_allocator;
        pAStack_560 = local_618.allocator;
        local_5c8 = (this->weight_data).elemsize;
        local_5c0 = (this->weight_data).allocator;
        local_5d8.super_ModelBin._vptr_ModelBin =
             (_func_int **)(local_5c8 * lVar21 * lVar20 + (long)(this->weight_data).data);
        local_5d8.weights = (Mat *)0x0;
        local_5b8 = 1;
        local_5b0 = 0x100000001;
        local_5a0 = (void *)(lVar21 * lVar20 * local_618.elemsize + (long)local_618.data);
        local_598 = (int *)0x0;
        local_590 = local_618.elemsize;
        local_588 = local_618.allocator;
        local_580 = 1;
        local_578 = 0x100000001;
        local_5b4 = iVar12;
        local_5a8 = lVar20;
        local_57c = iVar12;
        local_570 = lVar20;
        (*pLVar16->_vptr_Layer[5])(pLVar16,&local_5d8,&local_5a0,&local_568);
        (*pLVar16->_vptr_Layer[1])(pLVar16);
        if (local_598 != (int *)0x0) {
          LOCK();
          *local_598 = *local_598 + -1;
          UNLOCK();
          if (*local_598 == 0) {
            if (local_588 == (Allocator *)0x0) {
              if (local_5a0 != (void *)0x0) {
                free(*(void **)((long)local_5a0 + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_588 + 8))();
            }
          }
        }
        if (local_5d8.weights != (Mat *)0x0) {
          LOCK();
          *(int *)&(local_5d8.weights)->data = *(int *)&(local_5d8.weights)->data + -1;
          UNLOCK();
          if (*(int *)&(local_5d8.weights)->data == 0) {
            if (local_5c0 == (Allocator *)0x0) {
              if (local_5d8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                free(local_5d8.super_ModelBin._vptr_ModelBin[-1]);
              }
            }
            else {
              (**(code **)(*(long *)local_5c0 + 8))();
            }
          }
        }
        lVar23 = 0x4d8;
        do {
          piVar13 = *(int **)(local_548 + lVar23 + 8);
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (*(long **)((long)&local_530 + lVar23) == (long *)0x0) {
                if (*(long *)(local_548 + lVar23) != 0) {
                  free(*(void **)(*(long *)(local_548 + lVar23) + -8));
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_530 + lVar23) + 8))();
              }
            }
          }
          *(undefined1 (*) [16])(local_548 + lVar23) = (undefined1  [16])0x0;
          *(undefined8 *)((long)&local_538 + lVar23) = 0;
          *(undefined8 *)((long)local_518 + lVar23) = 0;
          *(undefined1 (*) [16])((long)&local_528 + lVar23) = (undefined1  [16])0x0;
          lVar23 = lVar23 + -0x40;
        } while (lVar23 != -0x28);
        lVar21 = lVar21 + 1;
      } while (lVar21 < this->group);
    }
    if (pMVar1 != &local_618) {
      if (local_618.refcount != (int *)0x0) {
        LOCK();
        *local_618.refcount = *local_618.refcount + 1;
        UNLOCK();
      }
      piVar13 = (this->weight_data).refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pvVar15 = (this->weight_data).data;
          pAVar19 = (this->weight_data).allocator;
          if (pAVar19 == (Allocator *)0x0) {
            if (pvVar15 != (void *)0x0) {
              free(*(void **)((long)pvVar15 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar19 + 8))();
          }
        }
      }
      (this->weight_data).data = local_618.data;
      (this->weight_data).refcount = local_618.refcount;
      (this->weight_data).elemsize = local_618.elemsize;
      (this->weight_data).allocator = local_618.allocator;
      (this->weight_data).dims = local_618.dims;
      (this->weight_data).w = local_618.w;
      (this->weight_data).h = local_618.h;
      (this->weight_data).c = local_618.c;
      (this->weight_data).cstep = local_618.cstep;
    }
    if (local_618.refcount != (int *)0x0) {
      LOCK();
      *local_618.refcount = *local_618.refcount + -1;
      UNLOCK();
      if (*local_618.refcount == 0) {
        if (local_618.allocator == (Allocator *)0x0) {
          if (local_618.data != (void *)0x0) {
            free(*(void **)((long)local_618.data - 8));
          }
        }
        else {
          (**(code **)(*(long *)local_618.allocator + 8))();
        }
      }
    }
  }
  if (this->use_int8_inference == true) {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (&this->quantize_ops,(long)this->group);
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (&this->dequantize_ops,(long)this->group);
    if (0 < this->group) {
      lVar21 = 0;
      do {
        pLVar16 = create_layer(0x39);
        (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar21] = pLVar16;
        ParamDict::ParamDict((ParamDict *)local_548);
        ParamDict::set((ParamDict *)local_548,0,
                       *(float *)((long)(this->bottom_blob_int8_scales).data + lVar21 * 4));
        (*(this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar21]->_vptr_Layer[2])();
        lVar20 = 0x4d8;
        do {
          piVar13 = *(int **)(local_548 + lVar20 + 8);
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (*(long **)((long)&local_530 + lVar20) == (long *)0x0) {
                if (*(long *)(local_548 + lVar20) != 0) {
                  free(*(void **)(*(long *)(local_548 + lVar20) + -8));
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_530 + lVar20) + 8))();
              }
            }
          }
          *(undefined1 (*) [16])(local_548 + lVar20) = (undefined1  [16])0x0;
          *(undefined8 *)((long)&local_538 + lVar20) = 0;
          *(undefined8 *)((long)local_518 + lVar20) = 0;
          *(undefined1 (*) [16])((long)&local_528 + lVar20) = (undefined1  [16])0x0;
          lVar20 = lVar20 + -0x40;
        } while (lVar20 != -0x28);
        lVar21 = lVar21 + 1;
      } while (lVar21 < this->group);
      if (0 < this->group) {
        lVar21 = 0;
        do {
          pLVar16 = create_layer(0x3a);
          (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar21] = pLVar16;
          fVar5 = *(float *)((long)(this->weight_data_int8_scales).data + lVar21 * 4);
          fVar6 = *(float *)((long)(this->bottom_blob_int8_scales).data + lVar21 * 4);
          ParamDict::ParamDict((ParamDict *)local_548);
          ParamDict::set((ParamDict *)local_548,0,1.0 / (fVar5 * fVar6));
          ParamDict::set((ParamDict *)local_548,1,this->bias_term);
          ParamDict::set((ParamDict *)local_548,2,1);
          pLVar16 = (this->dequantize_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar21];
          (*pLVar16->_vptr_Layer[2])(pLVar16,(ParamDict *)local_548);
          local_618.elemsize = (this->bias_data).elemsize;
          local_618.allocator = (this->bias_data).allocator;
          local_618.data = (void *)(local_618.elemsize * lVar21 + (long)(this->bias_data).data);
          local_618.refcount = (int *)0x0;
          local_618.dims = 1;
          local_618.w = 1;
          local_618.h = 1;
          local_618.c = 1;
          local_618.cstep = 1;
          pLVar16 = (this->dequantize_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar21];
          ModelBinFromMatArray::ModelBinFromMatArray(&local_5d8,&local_618);
          (*pLVar16->_vptr_Layer[3])(pLVar16);
          if (local_618.refcount != (int *)0x0) {
            LOCK();
            *local_618.refcount = *local_618.refcount + -1;
            UNLOCK();
            if (*local_618.refcount == 0) {
              if (local_618.allocator == (Allocator *)0x0) {
                if (local_618.data != (void *)0x0) {
                  free(*(void **)((long)local_618.data - 8));
                }
              }
              else {
                (**(code **)(*(long *)local_618.allocator + 8))();
              }
            }
          }
          lVar20 = 0x4d8;
          do {
            piVar13 = *(int **)(local_548 + lVar20 + 8);
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (*(long **)((long)&local_530 + lVar20) == (long *)0x0) {
                  if (*(long *)(local_548 + lVar20) != 0) {
                    free(*(void **)(*(long *)(local_548 + lVar20) + -8));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)&local_530 + lVar20) + 8))();
                }
              }
            }
            *(undefined1 (*) [16])(local_548 + lVar20) = (undefined1  [16])0x0;
            *(undefined8 *)((long)&local_538 + lVar20) = 0;
            *(undefined8 *)((long)local_518 + lVar20) = 0;
            *(undefined1 (*) [16])((long)&local_528 + lVar20) = (undefined1  [16])0x0;
            lVar20 = lVar20 + -0x40;
          } while (lVar20 != -0x28);
          lVar21 = lVar21 + 1;
        } while (lVar21 < this->group);
      }
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(group, 1);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            ncnn::Option opt = ncnn::get_default_option();
            opt.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}